

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O1

void xm_generate_samples(xm_context_t *ctx,float *output,size_t numsamples)

{
  long lVar1;
  uint8_t uVar2;
  xm_channel_context_t *pxVar3;
  xm_instrument_t *pxVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  ushort uVar10;
  ushort uVar11;
  ulong uVar12;
  xm_pattern_slot_t *pxVar13;
  uint uVar14;
  xm_channel_context_t *pxVar15;
  xm_pattern_t *pxVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_54;
  size_t local_50;
  
  ctx->generated_samples = ctx->generated_samples + numsamples;
  if (numsamples != 0) {
    local_50 = 0;
    do {
      if (ctx->remaining_samples_in_tick <= 0.0) {
        if (ctx->current_tick == 0) {
          if (ctx->position_jump == true) {
            bVar8 = ctx->jump_dest;
            ctx->current_table_index = bVar8;
            ctx->current_row = ctx->jump_row;
            ctx->position_jump = false;
            ctx->pattern_break = false;
            ctx->jump_row = '\0';
LAB_00105f25:
            if ((ctx->module).length <= (ushort)bVar8) {
              ctx->current_table_index = (uint8_t)(ctx->module).restart_position;
            }
          }
          else if (ctx->pattern_break == true) {
            bVar8 = ctx->current_table_index + 1;
            ctx->current_table_index = bVar8;
            ctx->current_row = ctx->jump_row;
            ctx->pattern_break = false;
            ctx->jump_row = '\0';
            goto LAB_00105f25;
          }
          bVar8 = (ctx->module).pattern_table[ctx->current_table_index];
          if ((ushort)bVar8 < (ctx->module).num_patterns) {
            pxVar16 = (ctx->module).patterns + bVar8;
          }
          else {
            pxVar16 = (xm_pattern_t *)0x0;
          }
          uVar11 = (ctx->module).num_channels;
          if (uVar11 == 0) {
LAB_00106011:
            uVar11._0_1_ = ctx->current_table_index;
            uVar11._1_1_ = ctx->current_row;
            uVar11 = uVar11 << 8 | uVar11 >> 8;
            uVar2 = ctx->row_loop_count[uVar11];
            ctx->row_loop_count[uVar11] = uVar2 + '\x01';
            ctx->loop_count = uVar2;
          }
          else {
            bVar7 = false;
            uVar14 = 1;
            do {
              uVar12 = (ulong)(uVar14 - 1 & 0xff);
              pxVar13 = (xm_pattern_slot_t *)&xm_row_empty_slot;
              if (pxVar16 != (xm_pattern_t *)0x0) {
                pxVar13 = pxVar16->slots + (ulong)ctx->current_row * (ulong)uVar11 + uVar12;
              }
              pxVar15 = ctx->channels + uVar12;
              ctx->channels[uVar12].current = pxVar13;
              if ((pxVar13->effect_type == '\x0e') && ((pxVar13->effect_param & 0xf0) == 0xd0)) {
                pxVar15->note_delay_param = pxVar13->effect_param & 0xf;
              }
              else {
                xm_handle_note_and_instrument(ctx,pxVar15,pxVar13);
              }
              if ((!bVar7) && (pxVar15->pattern_loop_count != '\0')) {
                bVar7 = true;
              }
              uVar11 = (ctx->module).num_channels;
              uVar10 = (ushort)uVar14;
              uVar14 = (uint)(byte)((char)uVar14 + 1);
            } while (uVar10 < uVar11);
            if (!bVar7) goto LAB_00106011;
          }
          bVar8 = ctx->current_row + 1;
          ctx->current_row = bVar8;
          if ((ctx->position_jump == false) && (ctx->pattern_break == false)) {
            if (pxVar16 == (xm_pattern_t *)0x0) {
              uVar11 = 0x40;
            }
            else {
              uVar11 = pxVar16->num_rows;
            }
            if ((bVar8 == 0) || (uVar11 <= bVar8)) {
              bVar8 = ctx->current_table_index + 1;
              ctx->current_table_index = bVar8;
              ctx->current_row = ctx->jump_row;
              ctx->jump_row = '\0';
              if ((ctx->module).length <= (ushort)bVar8) {
                ctx->current_table_index = (uint8_t)(ctx->module).restart_position;
              }
            }
          }
        }
        if ((ctx->module).num_channels != 0) {
          uVar14 = 1;
          do {
            pxVar3 = ctx->channels;
            uVar9 = uVar14 - 1 & 0xff;
            pxVar15 = pxVar3 + uVar9;
            xm_envelopes(pxVar15);
            pxVar4 = pxVar3[uVar9].instrument;
            if ((pxVar4 == (xm_instrument_t *)0x0) || (pxVar4->vibrato_depth == '\0')) {
              if ((pxVar15->autovibrato_note_offset != 0.0) ||
                 (NAN(pxVar15->autovibrato_note_offset))) {
                pxVar15->autovibrato_note_offset = 0.0;
                goto LAB_001061a6;
              }
            }
            else {
              uVar11 = pxVar15->autovibrato_ticks;
              if (uVar11 < pxVar4->vibrato_sweep) {
                local_54 = (float)uVar11 / (float)(ushort)pxVar4->vibrato_sweep;
              }
              else {
                local_54 = 1.0;
              }
              pxVar15->autovibrato_ticks = uVar11 + 1;
              fVar19 = xm_waveform(pxVar4->vibrato_type,
                                   (uint8_t)((uint)pxVar4->vibrato_rate * (uint)uVar11 >> 2));
              pxVar15->autovibrato_note_offset =
                   (((float)pxVar4->vibrato_depth * fVar19 * 0.25) / 15.0) * local_54;
LAB_001061a6:
              xm_update_frequency(ctx,pxVar15);
            }
            if ((pxVar15->arp_in_progress == true) &&
               ((pxVar15->current->effect_type != '\0' || (pxVar15->current->effect_param == '\0')))
               ) {
              pxVar15->arp_in_progress = false;
              pxVar15->arp_note_offset = '\0';
              xm_update_frequency(ctx,pxVar15);
            }
            if (((pxVar15->vibrato_in_progress == true) &&
                ((pxVar15->current->effect_type | 2) != 6)) &&
               ((pxVar15->current->volume_column & 0xf0) != 0xb0)) {
              pxVar15->vibrato_in_progress = false;
              pxVar15->vibrato_note_offset = 0.0;
              xm_update_frequency(ctx,pxVar15);
            }
            bVar8 = pxVar15->current->volume_column;
            switch(bVar8 >> 4) {
            case 6:
              if (ctx->current_tick != 0) {
                bVar8 = bVar8 & 0xf;
LAB_001062a4:
                xm_volume_slide(pxVar15,bVar8);
              }
              break;
            case 7:
              if (ctx->current_tick != 0) {
                bVar8 = bVar8 << 4;
                goto LAB_001062a4;
              }
              break;
            case 0xb:
              if (ctx->current_tick != 0) {
                pxVar15->vibrato_in_progress = false;
                xm_vibrato(ctx,pxVar15,pxVar15->vibrato_param);
              }
              break;
            case 0xd:
              if (ctx->current_tick != 0) {
                bVar8 = bVar8 & 0xf;
LAB_001062ce:
                xm_panning_slide(pxVar15,bVar8);
              }
              break;
            case 0xe:
              if (ctx->current_tick != 0) {
                bVar8 = bVar8 << 4;
                goto LAB_001062ce;
              }
              break;
            case 0xf:
              if (ctx->current_tick != 0) {
                xm_tone_portamento(ctx,pxVar15);
              }
            }
            pxVar13 = pxVar15->current;
            switch(pxVar13->effect_type) {
            case '\0':
              bVar8 = pxVar13->effect_param;
              if (bVar8 != 0) {
                uVar9 = (uint)ctx->tempo % 3;
                if ((short)uVar9 == 0) {
LAB_00106342:
                  uVar9 = ctx->current_tick - uVar9;
                  uVar9 = uVar9 + ((uVar9 & 0xffff) / 3) * -3;
                  if ((short)uVar9 == 2) {
LAB_00106741:
                    pxVar15->arp_in_progress = true;
                    bVar8 = bVar8 >> 4;
                  }
                  else if ((uVar9 & 0xffff) == 1) {
                    pxVar15->arp_in_progress = true;
                    bVar8 = bVar8 & 0xf;
                  }
                  else {
                    pxVar15->arp_in_progress = false;
                    bVar8 = 0;
                  }
                  pxVar15->arp_note_offset = bVar8;
                }
                else {
                  if ((uVar9 != 1) && (ctx->current_tick == 1)) goto LAB_00106741;
                  if (ctx->current_tick != 0) goto LAB_00106342;
                  pxVar15->arp_in_progress = false;
                  pxVar15->arp_note_offset = '\0';
                }
LAB_0010678e:
                xm_update_frequency(ctx,pxVar15);
              }
              break;
            case '\x01':
              if (ctx->current_tick != 0) {
                uVar9 = -(uint)pxVar15->portamento_up_param;
LAB_00106538:
                fVar19 = (float)(int)uVar9 * 4.0;
                if ((ctx->module).frequency_type != XM_LINEAR_FREQUENCIES) {
                  fVar19 = (float)(int)uVar9;
                }
                fVar19 = fVar19 + pxVar15->period;
                fVar20 = 0.0;
                if (0.0 <= fVar19) {
                  fVar20 = fVar19;
                }
                pxVar15->period = fVar20;
                goto LAB_0010678e;
              }
              break;
            case '\x02':
              if (ctx->current_tick != 0) {
                uVar9 = (uint)pxVar15->portamento_down_param;
                goto LAB_00106538;
              }
              break;
            case '\x03':
              if (ctx->current_tick != 0) {
                xm_tone_portamento(ctx,pxVar15);
              }
              break;
            case '\x04':
              if (ctx->current_tick != 0) {
                pxVar15->vibrato_in_progress = true;
                xm_vibrato(ctx,pxVar15,pxVar15->vibrato_param);
              }
              break;
            case '\x05':
              if (ctx->current_tick != 0) {
                xm_tone_portamento(ctx,pxVar15);
LAB_001066eb:
                xm_volume_slide(pxVar15,pxVar15->volume_slide_param);
              }
              break;
            case '\x06':
              if (ctx->current_tick != 0) {
                pxVar15->vibrato_in_progress = true;
                xm_vibrato(ctx,pxVar15,pxVar15->vibrato_param);
                goto LAB_001066eb;
              }
              break;
            case '\a':
              if (ctx->current_tick != 0) {
                bVar8 = pxVar15->tremolo_param;
                uVar2 = pxVar15->tremolo_ticks;
                pxVar15->tremolo_ticks = uVar2 + '\x01';
                fVar19 = xm_waveform(pxVar15->tremolo_waveform,(bVar8 >> 4) * uVar2);
                pxVar15->tremolo_volume = ((float)(bVar8 & 0xf) * fVar19) / -15.0;
              }
              break;
            case '\n':
              if (ctx->current_tick != 0) goto LAB_001066eb;
              break;
            case '\x0e':
              bVar8 = pxVar13->effect_param;
              bVar6 = bVar8 >> 4;
              if (bVar6 == 0xd) {
                if (ctx->current_tick == (ushort)pxVar15->note_delay_param) {
                  xm_handle_note_and_instrument(ctx,pxVar15,pxVar13);
LAB_00106737:
                  xm_envelopes(pxVar15);
                }
              }
              else if (bVar6 == 0xc) {
                if ((bVar8 & 0xf) == ctx->current_tick) goto LAB_00106711;
              }
              else if ((((bVar6 == 9) && (ctx->current_tick != 0)) && ((bVar8 & 0xf) != 0)) &&
                      ((uint)ctx->current_tick % (bVar8 & 0xf) == 0)) {
                xm_trigger_note(ctx,pxVar15,1);
                goto LAB_00106737;
              }
              break;
            case '\x11':
              if ((ctx->current_tick != 0) &&
                 (bVar8 = pxVar15->global_volume_slide_param, bVar8 < 0x10 || (bVar8 & 0xf) == 0)) {
                if (bVar8 < 0x10) {
                  fVar20 = (float)bVar8 * -0.015625 + ctx->global_volume;
                  fVar19 = 0.0;
                  if (0.0 <= fVar20) {
                    fVar19 = fVar20;
                  }
                }
                else {
                  fVar20 = (float)(bVar8 >> 4) * 0.015625 + ctx->global_volume;
                  fVar19 = 1.0;
                  if (fVar20 <= 1.0) {
                    fVar19 = fVar20;
                  }
                }
                ctx->global_volume = fVar19;
              }
              break;
            case '\x14':
              if (ctx->current_tick == (ushort)pxVar13->effect_param) {
                pxVar15->sustained = false;
                if ((pxVar15->instrument == (xm_instrument_t *)0x0) ||
                   ((pxVar15->instrument->volume_envelope).enabled == false)) {
LAB_00106711:
                  pxVar15->volume = 0.0;
                }
              }
              break;
            case '\x19':
              if (ctx->current_tick != 0) {
                xm_panning_slide(pxVar15,pxVar15->panning_slide_param);
              }
              break;
            case '\x1b':
              if (((ctx->current_tick != 0) && ((pxVar15->multi_retrig_param & 0xf) != 0)) &&
                 (((uint)ctx->current_tick % (pxVar15->multi_retrig_param & 0xf) == 0 &&
                  ((xm_trigger_note(ctx,pxVar15,9), pxVar15->current->volume_column == '\0' &&
                   ((pxVar15->instrument->volume_envelope).enabled == false)))))) {
                bVar8 = pxVar15->multi_retrig_param >> 4;
                fVar20 = pxVar15->volume * multi_retrig_multiply[bVar8] +
                         multi_retrig_add[bVar8] * 0.015625;
                fVar19 = 1.0;
                if ((fVar20 <= 1.0) && (fVar19 = fVar20, fVar20 < 0.0)) {
                  fVar19 = 0.0;
                }
                pxVar15->volume = fVar19;
              }
              break;
            case '\x1d':
              if (ctx->current_tick != 0) {
                uVar9 = (uint)(pxVar15->tremor_param >> 4);
                pxVar15->tremor_on =
                     uVar9 < (ctx->current_tick - 1) % ((pxVar15->tremor_param & 0xf) + uVar9 + 2);
              }
            }
            fVar19 = 0.0;
            if (pxVar15->tremor_on == false) {
              fVar20 = pxVar15->volume + pxVar15->tremolo_volume;
              fVar19 = 1.0;
              if ((fVar20 <= 1.0) && (fVar19 = fVar20, fVar20 < 0.0)) {
                fVar19 = 0.0;
              }
              fVar19 = pxVar15->fadeout_volume * pxVar15->volume_envelope_volume * fVar19;
            }
            fVar20 = (pxVar15->panning_envelope_panning + -0.5) *
                     (0.5 - ABS(pxVar15->panning + -0.5));
            fVar21 = fVar20 + fVar20 + pxVar15->panning;
            fVar20 = 1.0 - fVar21;
            if (fVar20 < 0.0) {
              fVar20 = sqrtf(fVar20);
            }
            else {
              fVar20 = SQRT(fVar20);
            }
            pxVar15->target_volume[0] = fVar20 * fVar19;
            if (fVar21 < 0.0) {
              fVar21 = sqrtf(fVar21);
            }
            else {
              fVar21 = SQRT(fVar21);
            }
            pxVar15->target_volume[1] = fVar19 * fVar21;
            uVar11 = (ushort)uVar14;
            uVar14 = (uint)(byte)((char)uVar14 + 1);
          } while (uVar11 < (ctx->module).num_channels);
        }
        uVar11 = ctx->current_tick + 1;
        ctx->current_tick = uVar11;
        if ((uint)ctx->extra_ticks + (uint)ctx->tempo <= (uint)uVar11) {
          ctx->current_tick = 0;
          ctx->extra_ticks = 0;
        }
        ctx->remaining_samples_in_tick =
             (float)ctx->rate / ((float)ctx->bpm * 0.4) + ctx->remaining_samples_in_tick;
      }
      ctx->remaining_samples_in_tick = ctx->remaining_samples_in_tick + -1.0;
      (output + local_50 * 2)[0] = 0.0;
      (output + local_50 * 2)[1] = 0.0;
      if ((ctx->max_loop_count == 0) || (ctx->loop_count < ctx->max_loop_count)) {
        if ((ctx->module).num_channels != 0) {
          lVar1 = local_50 * 2 + 1;
          uVar14 = 1;
          do {
            uVar9 = uVar14 - 1 & 0xff;
            if (((ctx->channels[uVar9].instrument != (xm_instrument_t *)0x0) &&
                (pxVar15 = ctx->channels + uVar9, pxVar15->sample != (xm_sample_t *)0x0)) &&
               (0.0 < pxVar15->sample_position || pxVar15->sample_position == 0.0)) {
              fVar19 = xm_next_of_sample(pxVar15);
              if ((pxVar15->muted == false) && (pxVar15->instrument->muted == false)) {
                output[local_50 * 2] = pxVar15->actual_volume[0] * fVar19 + output[local_50 * 2];
                output[lVar1] = fVar19 * pxVar15->actual_volume[1] + output[lVar1];
              }
              pxVar15->frame_count = pxVar15->frame_count + 1;
              fVar19 = pxVar15->target_volume[0];
              fVar20 = pxVar15->actual_volume[0];
              if (fVar20 <= fVar19) {
                if ((fVar20 < fVar19) &&
                   (fVar20 = fVar20 + ctx->volume_ramp, pxVar15->actual_volume[0] = fVar20,
                   fVar19 < fVar20)) goto LAB_00106a80;
              }
              else {
                fVar20 = fVar20 - ctx->volume_ramp;
                pxVar15->actual_volume[0] = fVar20;
                if (fVar20 < fVar19) {
LAB_00106a80:
                  pxVar15->actual_volume[0] = fVar19;
                }
              }
              fVar19 = pxVar15->target_volume[1];
              fVar20 = pxVar15->actual_volume[1];
              if (fVar20 <= fVar19) {
                if ((fVar20 < fVar19) &&
                   (fVar20 = fVar20 + ctx->volume_ramp, pxVar15->actual_volume[1] = fVar20,
                   fVar19 < fVar20)) goto LAB_00106ada;
              }
              else {
                fVar20 = fVar20 - ctx->volume_ramp;
                pxVar15->actual_volume[1] = fVar20;
                if (fVar20 < fVar19) {
LAB_00106ada:
                  pxVar15->actual_volume[1] = fVar19;
                }
              }
            }
            uVar11 = (ushort)uVar14;
            uVar14 = (uint)(byte)((char)uVar14 + 1);
          } while (uVar11 < (ctx->module).num_channels);
        }
        fVar19 = ctx->global_volume * ctx->amplification;
        fVar20 = fVar19 * (float)*(undefined8 *)(output + local_50 * 2);
        fVar19 = fVar19 * (float)((ulong)*(undefined8 *)(output + local_50 * 2) >> 0x20);
        *(ulong *)(output + local_50 * 2) = CONCAT44(fVar19,fVar20);
        iVar17 = -(uint)(1.0 < ABS(fVar20));
        iVar18 = -(uint)(1.0 < ABS(fVar19));
        auVar5._4_4_ = iVar17;
        auVar5._0_4_ = iVar17;
        auVar5._8_4_ = iVar18;
        auVar5._12_4_ = iVar18;
        iVar17 = movmskpd((int)output,auVar5);
        if (iVar17 != 0) {
          xm_generate_samples_cold_1();
        }
      }
      local_50 = local_50 + 1;
    } while (local_50 != numsamples);
  }
  return;
}

Assistant:

void xm_generate_samples(xm_context_t* ctx, float* output, size_t numsamples) {
	ctx->generated_samples += numsamples;

	for(size_t i = 0; i < numsamples; i++) {
		xm_sample(ctx, output + (2 * i), output + (2 * i + 1));
	}
}